

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_log2.hpp
# Opt level: O2

int boost::detail::integer_log2_impl<unsigned_long>(unsigned_long x,int n)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = (ulong)(uint)n;
  iVar3 = 0;
  while( true ) {
    if (x == 1) break;
    uVar4 = x >> ((byte)uVar1 & 0x3f);
    iVar2 = (int)uVar1;
    uVar1 = (long)iVar2 / 2;
    if (uVar4 == 0) {
      iVar2 = 0;
    }
    iVar3 = iVar2 + iVar3;
    if (uVar4 != 0) {
      x = uVar4;
    }
  }
  return iVar3;
}

Assistant:

int integer_log2_impl(T x, int n) {

      int result = 0;

      while (x != 1) {

          const T t = static_cast<T>(x >> n);
          if (t) {
              result += n;
              x = t;
          }
          n /= 2;

      }

      return result;
  }